

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O2

void __thiscall wasm::CodeFolding::doWalkFunction(CodeFolding *this,Function *func)

{
  pointer pTVar1;
  byte bVar2;
  ReFinalize local_198;
  Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *local_58;
  Expression **local_50;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *local_48;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *local_40;
  Function *local_38;
  
  this->anotherPass = true;
  local_58 = (Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
             &(this->
              super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
              ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>;
  local_50 = &func->body;
  local_48 = &this->unreachableTails;
  local_40 = &this->returnTails;
  bVar2 = 1;
  local_38 = func;
  while ((bVar2 & 1) != 0) {
    this->anotherPass = false;
    Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::walk(local_58,local_50);
    optimizeTerminatingTails(this,local_48,0);
    optimizeTerminatingTails(this,local_40,0);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>_>
    ::clear(&(this->breakTails)._M_t);
    pTVar1 = (this->unreachableTails).
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->unreachableTails).
        super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
      (this->unreachableTails).
      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    pTVar1 = (this->returnTails).
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->returnTails).
        super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
      (this->returnTails).
      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear(&(this->unoptimizables)._M_t);
    std::
    _Rb_tree<wasm::Expression_*,_wasm::Expression_*,_std::_Identity<wasm::Expression_*>,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
    ::clear(&(this->modifieds)._M_t);
    bVar2 = this->anotherPass;
    if ((bool)bVar2 == true) {
      ReFinalize::ReFinalize(&local_198);
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_198.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 local_38,(this->
                          super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                          ).
                          super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                          .
                          super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                          .super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
                          currModule);
      ReFinalize::~ReFinalize(&local_198);
      bVar2 = this->anotherPass;
    }
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    anotherPass = true;
    while (anotherPass) {
      anotherPass = false;
      super::doWalkFunction(func);
      optimizeTerminatingTails(unreachableTails);
      // optimize returns at the end, so we can benefit from a fallthrough if
      // there is a value TODO: separate passes for them?
      optimizeTerminatingTails(returnTails);
      // TODO add fallthrough for returns
      // TODO optimize returns not in blocks, a big return value can be worth it
      // clean up
      breakTails.clear();
      unreachableTails.clear();
      returnTails.clear();
      unoptimizables.clear();
      modifieds.clear();
      // if we did any work, types may need to be propagated
      if (anotherPass) {
        ReFinalize().walkFunctionInModule(func, getModule());
      }
    }
  }